

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O1

void __thiscall
absl::lts_20250127::cord_internal::InlineData::CopyInlineToString
          (InlineData *this,Nonnull<std::string_*> dst)

{
  ulong uVar1;
  
  if (((this->rep_).field_0.data[0] & 1U) == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)dst,0,(char *)dst->_M_string_length,(ulong)((long)&(this->rep_).field_0 + 1));
    uVar1 = (ulong)(this->rep_).field_0.data[0];
    if ((uVar1 & 1) == 0) {
      uVar1 = uVar1 >> 1;
      if (uVar1 <= dst->_M_string_length) {
        dst->_M_string_length = uVar1;
        (dst->_M_dataplus)._M_p[uVar1] = '\0';
        return;
      }
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    CopyInlineToString();
  }
  __assert_fail("!is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x281,
                "void absl::cord_internal::InlineData::CopyInlineToString(absl::Nonnull<std::string *>) const"
               );
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }